

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcMechanicalFastenerType::~IfcMechanicalFastenerType
          (IfcMechanicalFastenerType *this)

{
  ~IfcMechanicalFastenerType
            ((IfcMechanicalFastenerType *)
             (&(this->super_IfcFastenerType).super_IfcElementComponentType.super_IfcElementType.
               super_IfcTypeProduct.super_IfcTypeObject.field_0x0 +
             *(long *)(*(long *)&(this->super_IfcFastenerType).super_IfcElementComponentType.
                                 super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject +
                      -0x18)));
  return;
}

Assistant:

IfcMechanicalFastenerType() : Object("IfcMechanicalFastenerType") {}